

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_inv_gen(REF_INT n,REF_DBL *orig,REF_DBL *inv)

{
  undefined8 uVar1;
  REF_DBL RVar2;
  void *__ptr;
  int iVar3;
  long lVar4;
  double dVar5;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_70;
  double local_68;
  double local_58;
  REF_DBL temp;
  REF_DBL scale;
  REF_DBL pivot;
  REF_DBL *a;
  REF_INT best;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL *inv_local;
  REF_DBL *orig_local;
  REF_INT n_local;
  
  if (n * n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x48b,
           "ref_matrix_inv_gen","malloc a of REF_DBL negative");
    orig_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)(n * n) << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x48b,"ref_matrix_inv_gen","malloc a of REF_DBL NULL");
      orig_local._4_4_ = 2;
    }
    else {
      for (best = 0; best < n; best = best + 1) {
        for (k = 0; k < n; k = k + 1) {
          *(REF_DBL *)((long)__ptr + (long)(k + n * best) * 8) = orig[k + n * best];
        }
      }
      for (best = 0; best < n; best = best + 1) {
        for (k = 0; k < n; k = k + 1) {
          inv[k + n * best] = 0.0;
        }
      }
      for (k = 0; k < n; k = k + 1) {
        inv[k + n * k] = 1.0;
      }
      for (best = 0; best < n; best = best + 1) {
        a._0_4_ = best;
        a._4_4_ = best;
        while (a._4_4_ = a._4_4_ + 1, a._4_4_ < n) {
          if (*(double *)((long)__ptr + (long)(a._4_4_ + n * best) * 8) <= 0.0) {
            local_58 = -*(double *)((long)__ptr + (long)(a._4_4_ + n * best) * 8);
          }
          else {
            local_58 = *(double *)((long)__ptr + (long)(a._4_4_ + n * best) * 8);
          }
          if (*(double *)((long)__ptr + (long)((int)a + n * best) * 8) <= 0.0) {
            local_68 = -*(double *)((long)__ptr + (long)((int)a + n * best) * 8);
          }
          else {
            local_68 = *(double *)((long)__ptr + (long)((int)a + n * best) * 8);
          }
          if (local_68 < local_58) {
            a._0_4_ = a._4_4_;
          }
        }
        if ((int)a != best) {
          for (a._4_4_ = 0; a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
            uVar1 = *(undefined8 *)((long)__ptr + (long)(best + n * a._4_4_) * 8);
            *(undefined8 *)((long)__ptr + (long)(best + n * a._4_4_) * 8) =
                 *(undefined8 *)((long)__ptr + (long)((int)a + n * a._4_4_) * 8);
            *(undefined8 *)((long)__ptr + (long)((int)a + n * a._4_4_) * 8) = uVar1;
            RVar2 = inv[best + n * a._4_4_];
            inv[best + n * a._4_4_] = inv[(int)a + n * a._4_4_];
            inv[(int)a + n * a._4_4_] = RVar2;
          }
        }
        dVar5 = *(double *)((long)__ptr + (long)(best + n * best) * 8);
        for (a._4_4_ = 0; k = best, a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
          if (dVar5 * 1e+20 <= 0.0) {
            local_70 = -(dVar5 * 1e+20);
          }
          else {
            local_70 = dVar5 * 1e+20;
          }
          if (*(double *)((long)__ptr + (long)(best + a._4_4_ * n) * 8) <= 0.0) {
            local_80 = -*(double *)((long)__ptr + (long)(best + a._4_4_ * n) * 8);
          }
          else {
            local_80 = *(double *)((long)__ptr + (long)(best + a._4_4_ * n) * 8);
          }
          if (local_70 <= local_80) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            return 4;
          }
          lVar4 = (long)(best + a._4_4_ * n);
          *(double *)((long)__ptr + lVar4 * 8) = *(double *)((long)__ptr + lVar4 * 8) / dVar5;
          if (dVar5 * 1e+20 <= 0.0) {
            local_88 = -(dVar5 * 1e+20);
          }
          else {
            local_88 = dVar5 * 1e+20;
          }
          if (inv[best + a._4_4_ * n] <= 0.0) {
            local_98 = -inv[best + a._4_4_ * n];
          }
          else {
            local_98 = inv[best + a._4_4_ * n];
          }
          if (local_88 <= local_98) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            return 4;
          }
          iVar3 = best + a._4_4_ * n;
          inv[iVar3] = inv[iVar3] / dVar5;
        }
        while (k = k + 1, k < n) {
          if (*(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20 <= 0.0) {
            local_a0 = -(*(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20);
          }
          else {
            local_a0 = *(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20;
          }
          if (*(double *)((long)__ptr + (long)(k + best * n) * 8) <= 0.0) {
            local_b0 = -*(double *)((long)__ptr + (long)(k + best * n) * 8);
          }
          else {
            local_b0 = *(double *)((long)__ptr + (long)(k + best * n) * 8);
          }
          if (local_a0 <= local_b0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            return 4;
          }
          dVar5 = *(double *)((long)__ptr + (long)(k + best * n) * 8) /
                  *(double *)((long)__ptr + (long)(best + best * n) * 8);
          for (a._4_4_ = 0; a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
            lVar4 = (long)(k + a._4_4_ * n);
            *(double *)((long)__ptr + lVar4 * 8) =
                 -dVar5 * *(double *)((long)__ptr + (long)(best + a._4_4_ * n) * 8) +
                 *(double *)((long)__ptr + lVar4 * 8);
          }
          for (a._4_4_ = 0; a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
            iVar3 = k + a._4_4_ * n;
            inv[iVar3] = -dVar5 * inv[best + a._4_4_ * n] + inv[iVar3];
          }
        }
        for (k = 0; k < best; k = k + 1) {
          if (*(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20 <= 0.0) {
            local_b8 = -(*(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20);
          }
          else {
            local_b8 = *(double *)((long)__ptr + (long)(best + best * n) * 8) * 1e+20;
          }
          if (*(double *)((long)__ptr + (long)(k + best * n) * 8) <= 0.0) {
            local_c8 = -*(double *)((long)__ptr + (long)(k + best * n) * 8);
          }
          else {
            local_c8 = *(double *)((long)__ptr + (long)(k + best * n) * 8);
          }
          if (local_b8 <= local_c8) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            return 4;
          }
          dVar5 = *(double *)((long)__ptr + (long)(k + best * n) * 8) /
                  *(double *)((long)__ptr + (long)(best + best * n) * 8);
          for (a._4_4_ = 0; a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
            lVar4 = (long)(k + a._4_4_ * n);
            *(double *)((long)__ptr + lVar4 * 8) =
                 -dVar5 * *(double *)((long)__ptr + (long)(best + a._4_4_ * n) * 8) +
                 *(double *)((long)__ptr + lVar4 * 8);
          }
          for (a._4_4_ = 0; a._4_4_ < n; a._4_4_ = a._4_4_ + 1) {
            iVar3 = k + a._4_4_ * n;
            inv[iVar3] = -dVar5 * inv[best + a._4_4_ * n] + inv[iVar3];
          }
        }
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      orig_local._4_4_ = 0;
    }
  }
  return orig_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_gen(REF_INT n, REF_DBL *orig, REF_DBL *inv) {
  REF_INT i, j, k, best;
  REF_DBL *a;
  REF_DBL pivot, scale, temp;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) inv[i + n * j] = 0.0;
  for (i = 0; i < n; i++) inv[i + n * i] = 1.0;

  for (j = 0; j < n; j++) {
    /* find the best lower row */
    best = j;
    for (k = j + 1; k < n; k++)
      if (ABS(a[k + n * j]) > ABS(a[best + n * j])) best = k;

    if (best != j) /* if there is a better row then swap */
    {
      for (k = 0; k < n; k++) {
        temp = a[j + n * k];
        a[j + n * k] = a[best + n * k];
        a[best + n * k] = temp;
        temp = inv[j + n * k];
        inv[j + n * k] = inv[best + n * k];
        inv[best + n * k] = temp;
      }
    }

    /* scale row so a[j+n*j] is 1.0 */
    pivot = a[j + n * j];
    for (k = 0; k < n; k++) {
      if (!ref_math_divisible(a[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      a[j + k * n] /= pivot;
      if (!ref_math_divisible(inv[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      inv[j + k * n] /= pivot;
    }

    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }

    /* eliminate upper triangle */
    for (i = 0; i < j; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }
  }

  ref_free(a);
  return REF_SUCCESS;
}